

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.c
# Opt level: O2

distance_t metric_soft_distance_quadratic(uint hard_x,uint8_t *soft_y,size_t len)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = 0;
  for (uVar2 = 0; uVar2 < len; uVar2 = uVar2 + 1) {
    uVar3 = hard_x & 1;
    if (uVar3 != 0) {
      uVar3 = 0xff01;
    }
    hard_x = hard_x >> 1;
    uVar1 = uVar1 + (soft_y[uVar2] + uVar3) * (soft_y[uVar2] + uVar3);
  }
  return (distance_t)((uVar1 & 0xffff) >> 3);
}

Assistant:

distance_t metric_soft_distance_quadratic(unsigned int hard_x, const uint8_t *soft_y, size_t len) {
    distance_t dist = 0;
    for (unsigned int i = 0; i < len; i++) {
        // first, convert hard_x to a soft measurement (0 -> 0, 1 - > 255)
        unsigned int soft_x = (hard_x & 1) ? 255 : 0;
        hard_x >>= 1;
        int d = soft_y[i] - soft_x;
        dist += d*d;
    }
    return dist >> 3;
}